

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O2

void duckdb::ReservoirQuantileBindData::Serialize
               (Serializer *serializer,optional_ptr<duckdb::FunctionData,_true> bind_data_p,
               AggregateFunction *function)

{
  FunctionData *pFVar1;
  optional_ptr<duckdb::FunctionData,_true> bind_data_p_local;
  
  bind_data_p_local = bind_data_p;
  pFVar1 = optional_ptr<duckdb::FunctionData,_true>::operator->(&bind_data_p_local);
  Serializer::WriteProperty<duckdb::vector<double,true>>
            (serializer,100,"quantiles",(vector<double,_true> *)(pFVar1 + 1));
  Serializer::WriteProperty<unsigned_long>
            (serializer,0x65,"sample_size",(unsigned_long *)(pFVar1 + 4));
  return;
}

Assistant:

static void Serialize(Serializer &serializer, const optional_ptr<FunctionData> bind_data_p,
	                      const AggregateFunction &function) {
		auto &bind_data = bind_data_p->Cast<ReservoirQuantileBindData>();
		serializer.WriteProperty(100, "quantiles", bind_data.quantiles);
		serializer.WriteProperty(101, "sample_size", bind_data.sample_size);
	}